

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O0

int check_multiple_option_occurrences
              (char *prog_name,uint option_given,uint min,uint max,char *option_desc)

{
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  int error_occurred;
  uint local_24;
  
  local_24 = 0;
  if ((in_ESI != 0) && ((in_EDX != 0 || (in_ECX != 0)))) {
    if ((in_EDX == 0) || (in_ECX == 0)) {
      if (in_EDX == 0) {
        if (in_ECX != 0) {
          if (in_ECX < in_ESI) {
            fprintf(_stderr,"%s: %s option occurrences must be at most %d\n",in_RDI,in_R8,
                    (ulong)in_ECX);
          }
          local_24 = (uint)(in_ECX < in_ESI);
        }
      }
      else {
        if (in_ESI < in_EDX) {
          fprintf(_stderr,"%s: %s option occurrences must be at least %d\n",in_RDI,in_R8,
                  (ulong)in_EDX);
        }
        local_24 = (uint)(in_ESI < in_EDX);
      }
    }
    else if (in_EDX == in_ECX) {
      if (in_ESI != in_EDX) {
        fprintf(_stderr,"%s: %s option occurrences must be %d\n",in_RDI,in_R8,(ulong)in_EDX);
      }
      local_24 = (uint)(in_ESI != in_EDX);
    }
    else if ((in_ESI < in_EDX) || (in_ECX < in_ESI)) {
      fprintf(_stderr,"%s: %s option occurrences must be between %d and %d\n",in_RDI,in_R8,
              (ulong)in_EDX,(ulong)in_ECX);
      local_24 = 1;
    }
  }
  return local_24;
}

Assistant:

int
check_multiple_option_occurrences(const char *prog_name, unsigned int option_given, unsigned int min, unsigned int max, const char *option_desc)
{
  int error_occurred = 0;

  if (option_given && (min > 0 || max > 0))
    {
      if (min > 0 && max > 0)
        {
          if (min == max)
            {
              /* specific occurrences */
              if (option_given != (unsigned int) min)
                {
                  fprintf (stderr, "%s: %s option occurrences must be %d\n",
                    prog_name, option_desc, min);
                  error_occurred = 1;
                }
            }
          else if (option_given < (unsigned int) min
                || option_given > (unsigned int) max)
            {
              /* range occurrences */
              fprintf (stderr, "%s: %s option occurrences must be between %d and %d\n",
                prog_name, option_desc, min, max);
              error_occurred = 1;
            }
        }
      else if (min > 0)
        {
          /* at least check */
          if (option_given < min)
            {
              fprintf (stderr, "%s: %s option occurrences must be at least %d\n",
                prog_name, option_desc, min);
              error_occurred = 1;
            }
        }
      else if (max > 0)
        {
          /* at most check */
          if (option_given > max)
            {
              fprintf (stderr, "%s: %s option occurrences must be at most %d\n",
                prog_name, option_desc, max);
              error_occurred = 1;
            }
        }
    }
    
  return error_occurred;
}